

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::CartesianProductGenerator<const_libaom_test::CodecFactory_*,_int,_unsigned_int>::
~CartesianProductGenerator
          (CartesianProductGenerator<const_libaom_test::CodecFactory_*,_int,_unsigned_int> *this)

{
  CartesianProductGenerator<const_libaom_test::CodecFactory_*,_int,_unsigned_int> *in_RDI;
  
  ~CartesianProductGenerator(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

~CartesianProductGenerator() override {}